

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChSystemDescriptor.cpp
# Opt level: O2

void __thiscall
chrono::ChSystemDescriptor::ConvertToMatrixForm
          (ChSystemDescriptor *this,ChSparseMatrix *Z,ChVectorDynamic<> *rhs)

{
  Scalar SVar1;
  pointer ppCVar2;
  pointer ppCVar3;
  pointer ppCVar4;
  ChVariables *pCVar5;
  ChKblock *pCVar6;
  ChConstraint *pCVar7;
  int iVar8;
  Scalar *pSVar9;
  size_t ic;
  long lVar10;
  uint uVar11;
  long lVar12;
  size_t iv;
  long lVar13;
  size_t ik;
  ulong uVar14;
  int iVar15;
  size_t iv_1;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  ChVectorRef local_80;
  Type local_68;
  
  ppCVar2 = (this->vconstraints).
            super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ppCVar3 = (this->vstiffness).
            super__Vector_base<chrono::ChKblock_*,_std::allocator<chrono::ChKblock_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  iVar15 = 0;
  ppCVar4 = (this->vstiffness).
            super__Vector_base<chrono::ChKblock_*,_std::allocator<chrono::ChKblock_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  lVar12 = (long)(this->vconstraints).
                 super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)ppCVar2 >> 3;
  for (lVar10 = 0; lVar12 != lVar10; lVar10 = lVar10 + 1) {
    iVar15 = iVar15 + (uint)ppCVar2[lVar10]->active;
  }
  lVar10 = (long)(this->vvariables).
                 super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)(this->vvariables).
                 super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
                 _M_impl.super__Vector_impl_data._M_start >> 3;
  iVar8 = (*this->_vptr_ChSystemDescriptor[7])(this);
  this->n_q = iVar8;
  if (Z != (ChSparseMatrix *)0x0) {
    Eigen::SparseMatrix<double,_1,_int>::conservativeResize
              (Z,(long)(iVar8 + iVar15),(long)(iVar8 + iVar15));
    Eigen::SparseMatrix<double,_1,_int>::setZeroValues(Z);
    uVar14 = 0;
    for (lVar13 = 0; lVar10 != lVar13; lVar13 = lVar13 + 1) {
      pCVar5 = (this->vvariables).
               super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
               _M_impl.super__Vector_impl_data._M_start[lVar13];
      if (pCVar5->disabled == false) {
        (*pCVar5->_vptr_ChVariables[9])(this->c_a,pCVar5,Z,uVar14,uVar14);
        iVar8 = (*(this->vvariables).
                  super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
                  _M_impl.super__Vector_impl_data._M_start[lVar13]->_vptr_ChVariables[2])();
        uVar14 = (ulong)(uint)((int)uVar14 + iVar8);
      }
    }
    for (lVar13 = 0; (long)ppCVar3 - (long)ppCVar4 >> 3 != lVar13; lVar13 = lVar13 + 1) {
      pCVar6 = (this->vstiffness).
               super__Vector_base<chrono::ChKblock_*,_std::allocator<chrono::ChKblock_*>_>._M_impl.
               super__Vector_impl_data._M_start[lVar13];
      (*pCVar6->_vptr_ChKblock[6])(pCVar6,Z,1);
    }
    iVar8 = 0;
    for (lVar13 = 0; lVar12 != lVar13; lVar13 = lVar13 + 1) {
      pCVar7 = (this->vconstraints).
               super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>.
               _M_impl.super__Vector_impl_data._M_start[lVar13];
      if (pCVar7->active == true) {
        (*pCVar7->_vptr_ChConstraint[0xd])(pCVar7,Z,(ulong)(uint)(this->n_q + iVar8));
        pCVar7 = (this->vconstraints).
                 super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>
                 ._M_impl.super__Vector_impl_data._M_start[lVar13];
        (*pCVar7->_vptr_ChConstraint[0xe])(pCVar7,Z,(ulong)(uint)(this->n_q + iVar8));
        uVar11 = this->n_q + iVar8;
        (**Z->_vptr_SparseMatrix)
                  ((this->vconstraints).
                   super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>
                   ._M_impl.super__Vector_impl_data._M_start[lVar13]->cfm_i,Z,(ulong)uVar11,
                   (ulong)uVar11,1);
        iVar8 = iVar8 + 1;
      }
    }
  }
  if (rhs != (ChVectorDynamic<> *)0x0) {
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::setZero
              (&rhs->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,
               (long)iVar15 + (long)this->n_q,1);
    iVar15 = 0;
    for (lVar13 = 0; lVar10 != lVar13; lVar13 = lVar13 + 1) {
      pCVar5 = (this->vvariables).
               super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
               _M_impl.super__Vector_impl_data._M_start[lVar13];
      if (pCVar5->disabled == false) {
        ChVariables::Get_fb(&local_80,pCVar5);
        iVar8 = (*(this->vvariables).
                  super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
                  _M_impl.super__Vector_impl_data._M_start[lVar13]->_vptr_ChVariables[2])();
        Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::segment<int>
                  (&local_68,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)rhs,(long)iVar15,
                   iVar8);
        Eigen::internal::
        call_assignment<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>,Eigen::Ref<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::InnerStride<1>>>
                  (&local_68.super_Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,
                   &local_80);
        iVar8 = (*(this->vvariables).
                  super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
                  _M_impl.super__Vector_impl_data._M_start[lVar13]->_vptr_ChVariables[2])();
        iVar15 = iVar15 + iVar8;
      }
    }
    iVar15 = 0;
    for (lVar10 = 0; lVar12 != lVar10; lVar10 = lVar10 + 1) {
      pCVar7 = (this->vconstraints).
               super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>.
               _M_impl.super__Vector_impl_data._M_start[lVar10];
      if (pCVar7->active == true) {
        auVar17._8_8_ = 0;
        auVar17._0_8_ = pCVar7->b_i;
        auVar16._8_8_ = 0x8000000000000000;
        auVar16._0_8_ = 0x8000000000000000;
        auVar16 = vxorpd_avx512vl(auVar17,auVar16);
        pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)rhs,
                            (long)this->n_q + (long)iVar15);
        iVar15 = iVar15 + 1;
        SVar1 = (Scalar)vmovlps_avx(auVar16);
        *pSVar9 = SVar1;
      }
    }
  }
  return;
}

Assistant:

void ChSystemDescriptor::ConvertToMatrixForm(ChSparseMatrix* Z, ChVectorDynamic<>* rhs) {
    std::vector<ChConstraint*>& mconstraints = GetConstraintsList();
    std::vector<ChVariables*>& mvariables = GetVariablesList();

    auto mv_size = mvariables.size();
    auto mc_size = mconstraints.size();
    auto vs_size = vstiffness.size();

    // Count constraints.
    int mn_c = 0;
    for (size_t ic = 0; ic < mc_size; ic++) {
        if (mconstraints[ic]->IsActive())
            mn_c++;
    }

    // Count active variables, by scanning through all variable blocks, and set offsets.
    n_q = CountActiveVariables();

    if (Z) {
        Z->conservativeResize(n_q + mn_c, n_q + mn_c);
        Z->setZeroValues();        

        // Fill Z with masses and inertias.
        int s_q = 0;
        for (size_t iv = 0; iv < mv_size; iv++) {
            if (mvariables[iv]->IsActive()) {
                // Masses and inertias in upper-left block of Z
                mvariables[iv]->Build_M(*Z, s_q, s_q, c_a);
                s_q += mvariables[iv]->Get_ndof();
            }
        }

        // If present, add stiffness matrix K to upper-left block of Z.
        for (size_t ik = 0; ik < vs_size; ik++) {
            vstiffness[ik]->Build_K(*Z, true);
        }

        // Fill Z by looping over constraints.
        int s_c = 0;
        for (size_t ic = 0; ic < mc_size; ic++) {
            if (mconstraints[ic]->IsActive()) {
                // Constraint Jacobian in lower-left block of Z
                mconstraints[ic]->Build_Cq(*Z, n_q + s_c);
                // Transposed constraint Jacobian in upper-right block of Z
                mconstraints[ic]->Build_CqT(*Z, n_q + s_c);
                // E ( = cfm ) in lower-right block of Z
                Z->SetElement(n_q + s_c, n_q + s_c, mconstraints[ic]->Get_cfm_i());
                s_c++;
            }
        }
    }

    if (rhs) {
        rhs->setZero(n_q + mn_c, 1);

        // Fill rhs with forces.
        int s_q = 0;
        for (size_t iv = 0; iv < mv_size; iv++) {
            if (mvariables[iv]->IsActive()) {
                // Forces in upper section of rhs
                rhs->segment(s_q, vvariables[iv]->Get_ndof()) = vvariables[iv]->Get_fb();
                s_q += mvariables[iv]->Get_ndof();
            }
        }

        // Fill rhs by looping over constraints.
        int s_c = 0;
        for (size_t ic = 0; ic < mc_size; ic++) {
            if (mconstraints[ic]->IsActive()) {
                // -b term in lower section of rhs
                (*rhs)(n_q + s_c) = -(mconstraints[ic]->Get_b_i());
                s_c++;
            }
        }
    }
}